

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O1

void default_error_handler(exr_const_context_t_conflict ctxt,exr_result_t code,char *msg)

{
  FILE *__stream;
  char *pcVar1;
  exr_const_context_t_conflict p_Var2;
  char *__format;
  
  pthread_mutex_lock((pthread_mutex_t *)&default_error_handler::sMutex);
  __stream = _stderr;
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    fprintf(_stderr,"<ERROR>: %s\n",msg);
  }
  else {
    p_Var2 = (exr_const_context_t_conflict)(ctxt->filename).str;
    pcVar1 = exr_get_error_code_as_string(code);
    if (p_Var2 == (exr_const_context_t_conflict)0x0) {
      __format = "Context 0x%p: (%s) %s\n";
      p_Var2 = ctxt;
    }
    else {
      __format = "%s: (%s) %s\n";
    }
    fprintf(__stream,__format,p_Var2,pcVar1,msg);
  }
  fflush(_stderr);
  pthread_mutex_unlock((pthread_mutex_t *)&default_error_handler::sMutex);
  return;
}

Assistant:

static void
default_error_handler (
    exr_const_context_t ctxt, exr_result_t code, const char* msg)
{
#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
    static CRITICAL_SECTION sMutex;
    volatile static long    initialized = 0;
    if (InterlockedIncrement (&initialized) == 1)
        InitializeCriticalSection (&sMutex);
    initialized = 1; // avoids overflow on long running programs...
#    else
    static pthread_mutex_t sMutex = PTHREAD_MUTEX_INITIALIZER;
#    endif
#endif

#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
    EnterCriticalSection (&sMutex);
#    else
    pthread_mutex_lock (&sMutex);
#    endif
#endif
    if (ctxt)
    {
        if (ctxt->filename.str)
            fprintf (
                stderr,
                "%s: (%s) %s\n",
                ctxt->filename.str,
                exr_get_error_code_as_string (code),
                msg);
        else
            fprintf (
                stderr,
                "Context 0x%p: (%s) %s\n",
                (const void*) ctxt,
                exr_get_error_code_as_string (code),
                msg);
    }
    else
        fprintf (stderr, "<ERROR>: %s\n", msg);
    fflush (stderr);

#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
    LeaveCriticalSection (&sMutex);
#    else
    pthread_mutex_unlock (&sMutex);
#    endif
#endif
}